

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  Dict *pDVar1;
  Dict *pDVar2;
  Bool BVar3;
  Node *node;
  Node *pNVar4;
  Node **ppNVar5;
  TidyTagId tid;
  
  if ((pre->tag->model & 1) != 0) {
    return;
  }
  prvTidyInlineDup(doc,(Node *)0x0);
LAB_0012b699:
  node = prvTidyGetToken(doc,Preformatted);
  if (node == (Node *)0x0) {
    prvTidyReportError(doc,pre,(Node *)0x0,0xce);
    return;
  }
  if (node->type != EndTag) {
LAB_0012b714:
    BVar3 = prvTidynodeIsText(node);
    if (BVar3 == no) goto LAB_0012b747;
    goto LAB_0012b720;
  }
  pDVar1 = node->tag;
  pDVar2 = pre->tag;
  if (pDVar1 != pDVar2) {
    if (pDVar1 == (Dict *)0x0) {
      tid = TidyTag_UNKNOWN;
    }
    else {
      tid = pDVar1->id;
    }
    BVar3 = DescendantOf(pre,tid);
    if (BVar3 == no) goto LAB_0012b714;
  }
  if ((pDVar1 == (Dict *)0x0) || ((pDVar1->id | TidyTag_DT) != TidyTag_HTML)) {
    if (pDVar1 == pDVar2) {
      prvTidyFreeNode(doc,node);
    }
    else {
      prvTidyReportError(doc,pre,node,0xcf);
      prvTidyUngetToken(doc);
    }
    pre->closed = yes;
    goto LAB_0012b976;
  }
  goto LAB_0012b6f4;
LAB_0012b747:
  BVar3 = InsertMisc(pre,node);
  if (BVar3 != no) goto LAB_0012b699;
  if (node->tag == (Dict *)0x0) goto LAB_0012b6f4;
  if (node->tag->id != TidyTag_P) {
    BVar3 = prvTidynodeIsText(node);
    if ((BVar3 == no) &&
       (((node->tag == (Dict *)0x0 || (node->tag->id == TidyTag_PARAM)) ||
        (BVar3 = prvTidynodeHasCM(node,0x100010), BVar3 == no)))) {
      if (node->type != EndTag) {
        BVar3 = prvTidynodeHasCM(node,0x280);
        if ((BVar3 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE)))) {
          if (doc->lexer->exiled == no) {
            prvTidyReportError(doc,pre,node,0xcf);
          }
          prvTidyUngetToken(doc);
          return;
        }
        prvTidyInsertNodeAfterElement(pre,node);
        prvTidyReportError(doc,pre,node,0xcf);
        ParseTag(doc,node,IgnoreWhitespace);
        pNVar4 = prvTidyInferredTag(doc,TidyTag_PRE);
        prvTidyReportError(doc,pre,pNVar4,0xd7);
        prvTidyInsertNodeAfterElement(node,pNVar4);
        pre = pNVar4;
        goto LAB_0012b699;
      }
      if ((doc->lexer->exiled != no) &&
         ((BVar3 = prvTidynodeHasCM(node,0x80), BVar3 != no ||
          ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE)))))) {
        prvTidyUngetToken(doc);
LAB_0012b976:
        TrimSpaces(doc,pre);
        return;
      }
      goto LAB_0012b6f4;
    }
    if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_P)) {
      BVar3 = prvTidynodeIsElement(node);
      if (BVar3 != no) {
        if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_BR)) {
          TrimSpaces(doc,pre);
        }
        node->parent = pre;
        pNVar4 = pre->last;
        node->prev = pNVar4;
        ppNVar5 = &pNVar4->next;
        if (pNVar4 == (Node *)0x0) {
          ppNVar5 = &pre->content;
        }
        *ppNVar5 = node;
        pre->last = node;
        ParseTag(doc,node,Preformatted);
        goto LAB_0012b699;
      }
      goto LAB_0012b6f4;
    }
  }
  if (node->type == StartTag) {
    prvTidyReportError(doc,pre,node,0xd6);
    TrimSpaces(doc,pre);
    prvTidyCoerceNode(doc,node,TidyTag_BR,no,no);
    prvTidyFreeAttrs(doc,node);
LAB_0012b720:
    node->parent = pre;
    pNVar4 = pre->last;
    node->prev = pNVar4;
    ppNVar5 = &pNVar4->next;
    if (pNVar4 == (Node *)0x0) {
      ppNVar5 = &pre->content;
    }
    *ppNVar5 = node;
    pre->last = node;
    goto LAB_0012b699;
  }
LAB_0012b6f4:
  prvTidyReportError(doc,pre,node,0xd0);
  prvTidyFreeNode(doc,node);
  goto LAB_0012b699;
}

Assistant:

void TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node;

    if (pre->tag->model & CM_EMPTY)
        return;

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ((node = TY_(GetToken)(doc, Preformatted)) != NULL)
    {
        if ( node->type == EndTag && 
             (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
        {
            if (nodeIsBODY(node) || nodeIsHTML(node))
            {
                TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->tag == pre->tag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                TY_(UngetToken)( doc );
            }
            pre->closed = yes;
            TrimSpaces(doc, pre);
            return;
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(InsertNodeAtEnd)(pre, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(pre, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* strip unexpected tags */
        if ( !PreContent(doc, node) )
        {
            Node *newnode;

            /* fix for http://tidy.sf.net/bug/772205 */
            if (node->type == EndTag)
            {
                /* http://tidy.sf.net/issue/1590220 */ 
               if ( doc->lexer->exiled
                   && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
               {
                  TY_(UngetToken)(doc);
                  TrimSpaces(doc, pre);
                  return;
               }

               TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
               TY_(FreeNode)(doc, node);
               continue;
            }
            /* http://tidy.sf.net/issue/1590220 */
            else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                     || nodeIsTABLE(node) )
            {
                if (!doc->lexer->exiled)
                    /* No missing close warning if exiled. */
                    TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                TY_(UngetToken)(doc);
                return;
            }

            /*
              This is basically what Tidy 04 August 2000 did and far more accurate
              with respect to browser behaivour than the code commented out above.
              Tidy could try to propagate the <pre> into each disallowed child where
              <pre> is allowed in order to replicate some browsers behaivour, but
              there are a lot of exceptions, e.g. Internet Explorer does not propagate
              <pre> into table cells while Mozilla does. Opera 6 never propagates
              <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

              Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
              which are handled like Mozilla takes them (Opera6 closes all <pre> after
              the first </pre>).

              There are similar issues like replacing <p> in <pre> with <br>, for
              example

                <pre>...<p>...</pre>                 (Input)
                <pre>...<br>...</pre>                (Tidy)
                <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                <pre>...<p>...</p>...</pre>          (Input)
                <pre>...<br>......</pre>             (Tidy, BUG!)
                <pre>...<br>...<br>...</pre>         (Internet Explorer)
                <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                <pre>...<br>...<br><br>...</pre>     (Opera 7)
                
              or something similar, they could also be closing the <pre> and propagate
              the <pre> into the newly opened <p>.

              Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
              dissallowed in <pre>, Tidy neither detects this nor does it perform any
              cleanup operation. Tidy should at least issue a warning if it encounters
              such constructs.

              Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
            */
            TY_(InsertNodeAfterElement)(pre, node);
            TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_BEFORE);
            ParseTag(doc, node, IgnoreWhitespace);

            newnode = TY_(InferredTag)(doc, TidyTag_PRE);
            TY_(ReportError)(doc, pre, newnode, INSERTING_TAG);
            pre = newnode;
            TY_(InsertNodeAfterElement)(node, pre);

            continue;
        }

        if ( nodeIsP(node) )
        {
            if (node->type == StartTag)
            {
                TY_(ReportError)(doc, pre, node, USING_BR_INPLACE_OF);

                /* trim white space before <p> in <pre>*/
                TrimSpaces(doc, pre);
            
                /* coerce both <p> and </p> to <br> */
                TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                TY_(InsertNodeAtEnd)( pre, node );
            }
            else
            {
                TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if ( TY_(nodeIsElement)(node) )
        {
            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces(doc, pre);
            
            TY_(InsertNodeAtEnd)(pre, node);
            ParseTag(doc, node, Preformatted);
            continue;
        }

        /* discard unexpected tags */
        TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_FOR);
}